

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

If * __thiscall
wasm::Builder::makeIf
          (Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse,
          optional<wasm::Type> type)

{
  undefined1 auVar1 [12];
  If *this_00;
  optional<wasm::Type> type_;
  
  this_00 = (If *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_00->condition = condition;
  this_00->ifTrue = ifTrue;
  this_00->ifFalse = ifFalse;
  auVar1 = type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._0_12_;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)auVar1._0_8_;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)auVar1[8];
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = auVar1._9_3_;
  If::finalize(this_00,type_);
  return this_00;
}

Assistant:

If* makeIf(Expression* condition,
             Expression* ifTrue,
             Expression* ifFalse = nullptr,
             std::optional<Type> type = std::nullopt) {
    auto* ret = wasm.allocator.alloc<If>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize(type);
    return ret;
  }